

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

ClausePtr __thiscall Satyricon::SATSolver::propagation(SATSolver *this)

{
  uint uVar1;
  literal_value lVar2;
  pointer pWVar3;
  pointer pvVar4;
  pointer pWVar5;
  Watcher WVar6;
  pointer plVar7;
  iterator iVar8;
  ClausePtr pCVar9;
  pointer pWVar10;
  bool bVar11;
  ostream *poVar12;
  ulong uVar13;
  uint uVar14;
  pointer pLVar15;
  long lVar16;
  literal_value lVar17;
  pointer pWVar18;
  vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>> *pvVar19;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *__args;
  uint uVar20;
  ulong uVar21;
  string local_50;
  
  uVar13 = this->propagation_starting_pos;
  pLVar15 = (this->trail).
            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar13 < (ulong)((long)(this->trail).
                             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar15 >> 2)) {
    do {
      uVar21 = uVar13;
      if (1 < this->log_level) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"propagate ",10);
        Literal::print_abi_cxx11_
                  (&local_50,
                   (this->trail).
                   super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_start + this->propagation_starting_pos);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                             local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        uVar21 = this->propagation_starting_pos;
        pLVar15 = (this->trail).
                  super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      uVar13 = uVar21 + 1;
      this->propagation_starting_pos = uVar13;
      uVar14 = pLVar15[uVar21].value;
      pWVar3 = (this->propagation_to_move).
               super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pWVar18 = (this->propagation_to_move).
                super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pWVar18 != pWVar3) {
        (this->propagation_to_move).
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        ._M_impl.super__Vector_impl_data._M_finish = pWVar3;
        pWVar18 = pWVar3;
      }
      uVar21 = (ulong)uVar14 ^ 1;
      pvVar4 = (this->watch_list).
               super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pWVar5 = (this->propagation_to_move).
               super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pWVar10 = *(pointer *)
                 ((long)&pvVar4[uVar21].
                         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                         ._M_impl.super__Vector_impl_data + 8);
      (this->propagation_to_move).
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_start =
           pvVar4[uVar21].
           super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->propagation_to_move).
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar10;
      (this->propagation_to_move).
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&pvVar4[uVar21].
                    super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
      pvVar4[uVar21].
      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
      ._M_impl.super__Vector_impl_data._M_start = pWVar3;
      *(pointer *)
       ((long)&pvVar4[uVar21].
               super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
               ._M_impl.super__Vector_impl_data + 8) = pWVar18;
      *(pointer *)
       ((long)&pvVar4[uVar21].
               super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
               ._M_impl.super__Vector_impl_data + 0x10) = pWVar5;
      __args = &((this->propagation_to_move).
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0;
      if (__args != &((this->propagation_to_move).
                      super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->field_0) {
        do {
          WVar6.field_0 = (anon_union_8_2_f7e3ed0a_for_Watcher_0)__args->clause;
          uVar14 = *(uint *)((long)WVar6.field_0 + 8);
          uVar1 = *(uint *)((long)WVar6.field_0 + 0xc);
          uVar20 = (uint)uVar21;
          if (uVar14 == uVar20) {
            *(uint *)((long)WVar6.field_0 + 8) = uVar1;
            *(uint *)((long)WVar6.field_0 + 0xc) = uVar20;
            uVar14 = uVar1;
          }
          else if (uVar1 != uVar20) {
            __assert_fail("c[0]==failed || c[1]==failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                          ,0x14f,"SATSolver::ClausePtr Satyricon::SATSolver::propagation()");
          }
          plVar7 = (this->values).
                   super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = plVar7[uVar14 >> 1];
          lVar17 = LIT_TRUE - lVar2;
          if ((uVar14 & 1) == 0) {
            lVar17 = lVar2;
          }
          if (lVar17 == LIT_TRUE) {
            pvVar19 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                       *)((this->watch_list).
                          super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar21);
LAB_001121e8:
            iVar8._M_current = *(Watcher **)(pvVar19 + 8);
            if (iVar8._M_current == *(Watcher **)(pvVar19 + 0x10)) {
              std::
              vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>::
              _M_realloc_insert<Satyricon::SATSolver::Watcher_const&>
                        (pvVar19,iVar8,(Watcher *)__args);
            }
            else {
              ((iVar8._M_current)->field_0).clause = (ClausePtr)*(ClausePtr *)__args;
              *(long *)(pvVar19 + 8) = *(long *)(pvVar19 + 8) + 8;
            }
          }
          else {
            if (*(uint *)WVar6.field_0 >> 1 != 2) {
              lVar16 = 0;
              do {
                uVar14 = ((uint *)((long)WVar6.field_0 + 0x10))[lVar16];
                lVar2 = plVar7[uVar14 >> 1];
                lVar17 = LIT_TRUE - lVar2;
                if ((uVar14 & 1) == 0) {
                  lVar17 = lVar2;
                }
                if (lVar17 != LIT_FALSE) {
                  *(uint *)((long)WVar6.field_0 + 0xc) = uVar14;
                  ((uint *)((long)WVar6.field_0 + 0x10))[lVar16] = uVar20;
                  pvVar19 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                             *)((this->watch_list).
                                super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                               *(uint *)((long)WVar6.field_0 + 0xc));
                  goto LAB_001121e8;
                }
                lVar16 = lVar16 + 1;
              } while ((ulong)(*(uint *)WVar6.field_0 >> 1) - 2 != lVar16);
            }
            pvVar19 = (vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>
                       *)((this->watch_list).
                          super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar21);
            iVar8._M_current = *(Watcher **)(pvVar19 + 8);
            if (iVar8._M_current == *(Watcher **)(pvVar19 + 0x10)) {
              std::
              vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>::
              _M_realloc_insert<Satyricon::SATSolver::Watcher_const&>
                        (pvVar19,iVar8,(Watcher *)__args);
            }
            else {
              ((iVar8._M_current)->field_0).clause = (ClausePtr)*(ClausePtr *)__args;
              *(long *)(pvVar19 + 8) = *(long *)(pvVar19 + 8) + 8;
            }
            bVar11 = assign(this,(Literal)*(uint *)((long)WVar6.field_0 + 8),__args->clause);
            if (bVar11) {
              if (1 < this->log_level) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\tfound a conflict on ",0x15);
                Clause::print_abi_cxx11_(&local_50,__args->clause);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                                     local_50._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              pCVar9 = __args->clause;
              std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<Satyricon::SATSolver::Watcher*,std::back_insert_iterator<std::vector<Satyricon::SATSolver::Watcher,std::allocator<Satyricon::SATSolver::Watcher>>>>
                        ((Watcher *)(__args + 1),
                         (this->propagation_to_move).
                         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (this->watch_list).
                         super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar21);
              return pCVar9;
            }
          }
          __args = __args + 1;
        } while (__args != &((this->propagation_to_move).
                             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->field_0);
        uVar13 = this->propagation_starting_pos;
        pLVar15 = (this->trail).
                  super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
    } while (uVar13 < (ulong)((long)(this->trail).
                                    super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar15 >> 2)
            );
  }
  return (ClausePtr)0x0;
}

Assistant:

SATSolver::ClausePtr SATSolver::propagation() {

    while ( propagation_starting_pos < trail.size() ) {

        PRINT_VERBOSE("propagate " << trail[propagation_starting_pos] << endl);

        // extract the list of the opposite literal 
        // (they are false now, their watcher must be moved)
        auto failed = !trail[propagation_starting_pos++];
        propagation_to_move.clear();
        swap(propagation_to_move,watch_list[failed.index()]);

        for (auto it = propagation_to_move.begin();
                it != propagation_to_move.end(); ++it) {

            // propagate effect on a clause
            Clause &c = *(it->get_clause()); // usefull reference
            assert(c[0]==failed || c[1]==failed);

            // make sure the false literal is in position 1
            if ( c[0] == failed ) { c[0] = c[1]; c[1] = failed; }

            // if the clause is already solved, nothing need to be moved
            if (get_asigned_value(c[0]) == LIT_TRUE) {
                // reinsert inside the previous watch list
                watch_list[failed.index()].push_back(*it);
                continue; // move to the next
            }

            // search a new literal to watch
            bool foundt_new_watch = false;
            for ( size_t pos = 2; pos != c.size(); ++pos) {
                if ( get_asigned_value(c[pos]) != LIT_FALSE ) {
                    // swap value
                    c[1] = c[pos]; c[pos] = failed;
                    // insert in the new watch list
                    watch_list[c[1].index()].push_back(*it);
                    // move to the next
                    foundt_new_watch = true;
                    break;
                }
            }
            if ( foundt_new_watch ) continue; // move to the next

            // no new literal to watch, reinsert in the old position
            watch_list[failed.index()].push_back(*it);

            // the clause must be a conflict or a unit, try to assign the value
            bool conflict = assign(c[0],it->get_clause());
            if ( ! conflict ) continue; // no problem, move to the next

            // conflict found in propagation 
            PRINT_VERBOSE("\tfound a conflict on " << (it->get_clause())->print() << endl);
            ClausePtr conflict_clause = it->get_clause();

            // reset the other literal to move (it is already set by propagate)
            copy(++it, propagation_to_move.end(),
                    back_inserter(watch_list[failed.index()]));

            return conflict_clause;
        }
    }
    return nullptr; // no conflict
}